

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentStack.h
# Opt level: O3

void __thiscall
ConcurrentStack<Door_*>::ConcurrentStack(ConcurrentStack<Door_*> *this,size_t capacity)

{
  (this->stack_).c.super__Deque_base<Door_*,_std::allocator<Door_*>_>._M_impl.super__Deque_impl_data
  ._M_finish._M_last = (_Elt_pointer)0x0;
  (this->stack_).c.super__Deque_base<Door_*,_std::allocator<Door_*>_>._M_impl.super__Deque_impl_data
  ._M_finish._M_node = (_Map_pointer)0x0;
  (this->stack_).c.super__Deque_base<Door_*,_std::allocator<Door_*>_>._M_impl.super__Deque_impl_data
  ._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->stack_).c.super__Deque_base<Door_*,_std::allocator<Door_*>_>._M_impl.super__Deque_impl_data
  ._M_finish._M_first = (_Elt_pointer)0x0;
  (this->stack_).c.super__Deque_base<Door_*,_std::allocator<Door_*>_>._M_impl.super__Deque_impl_data
  ._M_start._M_last = (_Elt_pointer)0x0;
  (this->stack_).c.super__Deque_base<Door_*,_std::allocator<Door_*>_>._M_impl.super__Deque_impl_data
  ._M_start._M_node = (_Map_pointer)0x0;
  (this->stack_).c.super__Deque_base<Door_*,_std::allocator<Door_*>_>._M_impl.super__Deque_impl_data
  ._M_start._M_cur = (_Elt_pointer)0x0;
  (this->stack_).c.super__Deque_base<Door_*,_std::allocator<Door_*>_>._M_impl.super__Deque_impl_data
  ._M_start._M_first = (_Elt_pointer)0x0;
  (this->stack_).c.super__Deque_base<Door_*,_std::allocator<Door_*>_>._M_impl.super__Deque_impl_data
  ._M_map = (_Map_pointer)0x0;
  (this->stack_).c.super__Deque_base<Door_*,_std::allocator<Door_*>_>._M_impl.super__Deque_impl_data
  ._M_map_size = 0;
  std::_Deque_base<Door_*,_std::allocator<Door_*>_>::_M_initialize_map
            ((_Deque_base<Door_*,_std::allocator<Door_*>_> *)this,0);
  this->max_size_ = capacity;
  this->bounded_ = capacity != 0;
  (this->timeout_).__r = 0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->queue_full_);
  std::condition_variable::condition_variable(&this->queue_empty_);
  return;
}

Assistant:

ConcurrentStack(const size_t capacity = 10) :
            max_size_(capacity), bounded_(capacity > 0) {}